

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextColoredV(ImVec4 *col,char *fmt,__va_list_tag *args)

{
  float fVar1;
  long lVar2;
  ImVec4 *in_RDX;
  char *in_RSI;
  ImGuiTextFlags in_stack_000000f4;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  undefined8 in_stack_ffffffffffffffd0;
  int count;
  __va_list_tag *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  count = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),in_RDX);
  if (((*in_RSI == '%') && (in_RSI[1] == 's')) && (in_RSI[2] == '\0')) {
    fVar1 = in_RDX->x;
    if ((uint)fVar1 < 0x29) {
      lVar2 = (long)(int)fVar1 + *(long *)(in_RDX + 1);
      in_RDX->x = (float)((int)fVar1 + 8);
    }
    else {
      lVar2 = *(long *)&in_RDX->z;
      *(long *)&in_RDX->z = lVar2 + 8;
    }
    count = (int)((ulong)lVar2 >> 0x20);
    TextEx(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  }
  else {
    TextV((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
          in_stack_ffffffffffffffd8);
  }
  PopStyleColor(count);
  return;
}

Assistant:

void ImGui::TextColoredV(const ImVec4& col, const char* fmt, va_list args)
{
    PushStyleColor(ImGuiCol_Text, col);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    PopStyleColor();
}